

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

void __thiscall
capnp::TwoPartyVatNetwork::OutgoingMessageImpl::OutgoingMessageImpl
          (OutgoingMessageImpl *this,TwoPartyVatNetwork *network,uint firstSegmentWordSize)

{
  uint firstSegmentWords;
  
  (this->super_Refcounted).refcount = 0;
  (this->super_OutgoingRpcMessage)._vptr_OutgoingRpcMessage = (_func_int **)&PTR_getBody_00647340;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00647370;
  this->network = network;
  firstSegmentWords = 0x400;
  if (firstSegmentWordSize != 0) {
    firstSegmentWords = firstSegmentWordSize;
  }
  MallocMessageBuilder::MallocMessageBuilder(&this->message,firstSegmentWords,GROW_HEURISTICALLY);
  return;
}

Assistant:

OutgoingMessageImpl(TwoPartyVatNetwork& network, uint firstSegmentWordSize)
      : network(network),
        message(firstSegmentWordSize == 0 ? SUGGESTED_FIRST_SEGMENT_WORDS : firstSegmentWordSize) {}